

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O0

int __thiscall
ON_Viewport::GetBoundingBoxDepth
          (ON_Viewport *this,ON_BoundingBox bbox,ON_Xform *bbox_xform,double *near_dist,
          double *far_dist,bool bGrowNearFar)

{
  ON_3dPoint *corners;
  ON_PlaneEquation *left_plane_equation;
  ON_3dPoint P_00;
  ON_3dPoint P_01;
  ON_3dPoint P_02;
  ON_3dPoint P_03;
  ON_3dPoint P_04;
  ON_3dPoint P_05;
  ON_3dPoint P_06;
  ON_3dVector N;
  uint uVar1;
  bool bVar2;
  ON_3dPoint *p;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int local_bf4;
  ON_3dVector local_bd8;
  ON_3dVector local_bc0;
  double local_ba8;
  double local_ba0;
  double local_b98;
  ON_3dPoint local_b90;
  ON_3dPoint local_b78;
  ON_3dPoint local_b60;
  uint local_b48 [2];
  uint e [12] [2];
  double local_ae0;
  double local_ad8;
  ON_3dPoint local_ad0;
  uint local_ab8 [2];
  uint Linout [4];
  ON_3dPoint local_a28;
  ON_3dVector local_a10;
  double local_9f8;
  double local_9f0;
  double local_9e8;
  undefined8 uStack_9e0;
  uint local_9d8;
  bool bPerspectiveProjection;
  bool bTrimmed;
  uint uStack_9d4;
  bool rc;
  uint Pcount;
  uint Pout;
  uint Pin;
  uint k;
  uint j;
  uint i;
  double tol;
  double v1;
  double v0;
  double v [4] [8];
  double t [2];
  double d;
  double Lbuffer [24];
  double Sbuffer [20];
  double Pbuffer [216];
  ON_3dPoint Q;
  ON_Line *L;
  ON_PlaneEquation *S;
  ON_3dPoint *P;
  ON_3dPoint *C;
  bool bGrowNearFar_local;
  double *far_dist_local;
  double *near_dist_local;
  ON_Xform *bbox_xform_local;
  ON_Viewport *this_local;
  
  dVar5 = ON_3dPoint::MaximumCoordinate(&this->m_CamLoc);
  _j = (dVar5 + 1.0) * 1.490116119385e-08;
  corners = (ON_3dPoint *)(Sbuffer + 0x13);
  p = (ON_3dPoint *)(Pbuffer + 0x17);
  left_plane_equation = (ON_PlaneEquation *)(Lbuffer + 0x17);
  uStack_9e0._6_1_ = 0;
  uStack_9e0._5_1_ = this->m_projection == perspective_view;
  uStack_9e0._7_1_ = ON_BoundingBox::GetCorners(&bbox,corners);
  if (((!(bool)uStack_9e0._7_1_) ||
      (((bbox_xform != (ON_Xform *)0x0 &&
        (uStack_9e0._7_1_ = ON_Xform::IsValid(bbox_xform), !(bool)uStack_9e0._7_1_)) ||
       (uStack_9e0._7_1_ = GetFrustumLeftPlaneEquation(this,left_plane_equation),
       !(bool)uStack_9e0._7_1_)))) ||
     (((uStack_9e0._7_1_ = GetFrustumRightPlaneEquation(this,(ON_PlaneEquation *)(Sbuffer + 3)),
       !(bool)uStack_9e0._7_1_ ||
       (uStack_9e0._7_1_ = GetFrustumBottomPlaneEquation(this,(ON_PlaneEquation *)(Sbuffer + 7)),
       !(bool)uStack_9e0._7_1_)) ||
      (uStack_9e0._7_1_ = GetFrustumTopPlaneEquation(this,(ON_PlaneEquation *)(Sbuffer + 0xb)),
      !(bool)uStack_9e0._7_1_)))) goto LAB_0098c2df;
  local_9f8 = (this->m_CamLoc).x;
  local_9f0 = (this->m_CamLoc).y;
  local_9e8 = (this->m_CamLoc).z;
  ON_3dVector::operator-(&local_a10,&this->m_CamZ);
  P_00.y = local_9f0;
  P_00.x = local_9f8;
  P_00.z = local_9e8;
  N.y = local_a10.y;
  N.x = local_a10.x;
  N.z = local_a10.z;
  ON_PlaneEquation::Create((ON_PlaneEquation *)(Sbuffer + 0xf),P_00,N);
  local_9d8 = 0;
  Pcount = 0;
  uStack_9d4 = 0;
  for (k = 0; k < 8; k = k + 1) {
    if (bbox_xform != (ON_Xform *)0x0) {
      ON_Xform::operator*(&local_a28,bbox_xform,corners + k);
      uVar3 = (ulong)k;
      corners[uVar3].x = local_a28.x;
      Pbuffer[uVar3 * 3] = local_a28.y;
      Pbuffer[uVar3 * 3 + 1] = local_a28.z;
    }
    Pout = 0;
    uVar3 = (ulong)k;
    P_01.y = Pbuffer[uVar3 * 3];
    P_01.x = corners[uVar3].x;
    P_01.z = Pbuffer[uVar3 * 3 + 1];
    dVar5 = ON_PlaneEquation::ValueAt(left_plane_equation,P_01);
    v[-1][(ulong)k + 7] = dVar5;
    if (dVar5 < -_j) {
      uStack_9d4 = uStack_9d4 | 1;
    }
    else {
      Pout = Pout | 1;
    }
    uVar3 = (ulong)k;
    P_02.y = Pbuffer[uVar3 * 3];
    P_02.x = corners[uVar3].x;
    P_02.z = Pbuffer[uVar3 * 3 + 1];
    dVar5 = ON_PlaneEquation::ValueAt((ON_PlaneEquation *)(Sbuffer + 3),P_02);
    t[(ulong)k - 0x19] = dVar5;
    if (dVar5 < -_j) {
      uStack_9d4 = uStack_9d4 | 2;
    }
    else {
      Pout = Pout | 2;
    }
    uVar3 = (ulong)k;
    P_03.y = Pbuffer[uVar3 * 3];
    P_03.x = corners[uVar3].x;
    P_03.z = Pbuffer[uVar3 * 3 + 1];
    dVar5 = ON_PlaneEquation::ValueAt((ON_PlaneEquation *)(Sbuffer + 7),P_03);
    t[(ulong)k - 0x11] = dVar5;
    if (dVar5 < -_j) {
      uStack_9d4 = uStack_9d4 | 4;
    }
    else {
      Pout = Pout | 4;
    }
    uVar3 = (ulong)k;
    P_04.y = Pbuffer[uVar3 * 3];
    P_04.x = corners[uVar3].x;
    P_04.z = Pbuffer[uVar3 * 3 + 1];
    dVar5 = ON_PlaneEquation::ValueAt((ON_PlaneEquation *)(Sbuffer + 0xb),P_04);
    t[(ulong)k - 9] = dVar5;
    if (dVar5 < -_j) {
      uStack_9d4 = uStack_9d4 | 8;
    }
    else {
      Pout = Pout | 8;
    }
    if ((uStack_9e0._5_1_ & 1) == 0) {
LAB_0098b9ce:
      Pout = Pout | 0x10;
    }
    else {
      uVar3 = (ulong)k;
      P_05.y = Pbuffer[uVar3 * 3];
      P_05.x = corners[uVar3].x;
      P_05.z = Pbuffer[uVar3 * 3 + 1];
      dVar5 = ON_PlaneEquation::ValueAt((ON_PlaneEquation *)(Sbuffer + 0xf),P_05);
      if (0.0 < dVar5) goto LAB_0098b9ce;
    }
    Pcount = Pout | Pcount;
    if (Pout == 0x1f) {
      uVar3 = (ulong)k;
      uVar4 = (ulong)local_9d8;
      p[uVar4].x = corners[uVar3].x;
      Pbuffer[uVar4 * 3 + 0x18] = Pbuffer[uVar3 * 3];
      Pbuffer[uVar4 * 3 + 0x19] = Pbuffer[uVar3 * 3 + 1];
      local_9d8 = local_9d8 + 1;
    }
  }
  if (local_9d8 < 8) {
    uStack_9e0._6_1_ = 1;
    if (Pcount != 0x1f) {
      uStack_9e0._7_1_ = false;
      goto LAB_0098c2df;
    }
    Pin = 0;
    if ((uStack_9e0._5_1_ & 1) == 0) {
      uStack_9e0._7_1_ =
           GetNearRect(this,(ON_3dPoint *)&d,(ON_3dPoint *)(Lbuffer + 5),
                       (ON_3dPoint *)(Lbuffer + 0xb),(ON_3dPoint *)(Lbuffer + 0x11));
      if (!(bool)uStack_9e0._7_1_) goto LAB_0098c2df;
    }
    else {
      dVar5 = ON_BoundingBox::MinimumDistanceTo(&bbox,&this->m_CamLoc);
      if (dVar5 <= 0.0) {
        uVar3 = (ulong)local_9d8;
        p[uVar3].x = (this->m_CamLoc).x;
        Pbuffer[uVar3 * 3 + 0x18] = (this->m_CamLoc).y;
        Pbuffer[uVar3 * 3 + 0x19] = (this->m_CamLoc).z;
        Pin = 1;
        local_9d8 = local_9d8 + 1;
      }
      d = (this->m_CamLoc).x;
      Lbuffer[0] = (this->m_CamLoc).y;
      Lbuffer[1] = (this->m_CamLoc).z;
      Lbuffer[5] = (this->m_CamLoc).x;
      Lbuffer[6] = (this->m_CamLoc).y;
      Lbuffer[7] = (this->m_CamLoc).z;
      Lbuffer[0xb] = (this->m_CamLoc).x;
      Lbuffer[0xc] = (this->m_CamLoc).y;
      Lbuffer[0xd] = (this->m_CamLoc).z;
      Lbuffer[0x11] = (this->m_CamLoc).x;
      Lbuffer[0x12] = (this->m_CamLoc).y;
      Lbuffer[0x13] = (this->m_CamLoc).z;
    }
    uStack_9e0._7_1_ =
         GetFarRect(this,(ON_3dPoint *)(Lbuffer + 2),(ON_3dPoint *)(Lbuffer + 8),
                    (ON_3dPoint *)(Lbuffer + 0xe),(ON_3dPoint *)(Lbuffer + 0x14));
    if (!(bool)uStack_9e0._7_1_) goto LAB_0098c2df;
    local_ab8[0] = 5;
    local_ab8[1] = 6;
    Linout[0] = 9;
    Linout[1] = 10;
    Pout = Pcount & uStack_9d4;
    for (k = 0; k < 4; k = k + 1) {
      if ((Linout[(ulong)k - 2] == (Pout & Linout[(ulong)k - 2])) &&
         (bVar2 = ON_Intersect(&bbox,(ON_Line *)((ON_3dPoint *)&d + (ulong)k * 2),_j,
                               (ON_Interval *)(v[3] + 7)), bVar2)) {
        if ((uStack_9e0._5_1_ & 1) != 0) {
          if (t[0] < 0.0) goto LAB_0098be25;
          if (v[3][7] < 0.0) {
            if (Pin == 0) {
              uVar3 = (ulong)local_9d8;
              p[uVar3].x = (this->m_CamLoc).x;
              Pbuffer[uVar3 * 3 + 0x18] = (this->m_CamLoc).y;
              Pbuffer[uVar3 * 3 + 0x19] = (this->m_CamLoc).z;
              Pin = 1;
              local_9d8 = local_9d8 + 1;
            }
            v[3][7] = t[0];
          }
        }
        ON_Line::PointAt(&local_ad0,(ON_Line *)((ON_3dPoint *)&d + (ulong)k * 2),v[3][7]);
        uVar1 = local_9d8;
        local_9d8 = local_9d8 + 1;
        uVar3 = (ulong)uVar1;
        p[uVar3].x = local_ad0.x;
        Pbuffer[uVar3 * 3 + 0x18] = local_ad0.y;
        Pbuffer[uVar3 * 3 + 0x19] = local_ad0.z;
        if (v[3][7] < t[0]) {
          ON_Line::PointAt((ON_3dPoint *)(e + 0xb),(ON_Line *)((ON_3dPoint *)&d + (ulong)k * 2),t[0]
                          );
          uVar1 = local_9d8;
          local_9d8 = local_9d8 + 1;
          uVar3 = (ulong)uVar1;
          p[uVar3].x = (double)e[0xb];
          Pbuffer[uVar3 * 3 + 0x18] = local_ae0;
          Pbuffer[uVar3 * 3 + 0x19] = local_ad8;
        }
      }
LAB_0098be25:
    }
    memcpy(local_b48,&DAT_00a26320,0x60);
    for (k = 0; k < 4; k = k + 1) {
      for (Pin = 0; Pin < 0xc; Pin = Pin + 1) {
        v1 = v[(ulong)k - 1][(ulong)local_b48[(ulong)Pin * 2] + 7];
        tol = v[(ulong)k - 1][(ulong)e[(ulong)Pin - 1][1] + 7];
        if (v1 * tol < 0.0) {
          dVar5 = v1 / (v1 - tol);
          ::operator*(&local_b78,1.0 - dVar5,corners + local_b48[(ulong)Pin * 2]);
          ::operator*(&local_b90,dVar5,corners + e[(ulong)Pin - 1][1]);
          ON_3dPoint::operator+(&local_b60,&local_b78,&local_b90);
          uVar1 = local_9d8;
          dVar7 = local_b60.z;
          dVar5 = local_b60.y;
          Pbuffer[0xd7] = local_b60.x;
          local_9d8 = local_9d8 + 1;
          uVar3 = (ulong)uVar1;
          p[uVar3].x = local_b60.x;
          Pbuffer[uVar3 * 3 + 0x18] = local_b60.y;
          Pbuffer[uVar3 * 3 + 0x19] = local_b60.z;
          for (Pout = 0; Pout < 4; Pout = Pout + 1) {
            if (k != Pout) {
              local_ba8 = Pbuffer[0xd7];
              local_ba0 = dVar5;
              local_b98 = dVar7;
              P_06.y = dVar5;
              P_06.x = Pbuffer[0xd7];
              P_06.z = dVar7;
              dVar6 = ON_PlaneEquation::ValueAt(left_plane_equation + Pout,P_06);
              if (dVar6 <= -_j) {
                local_9d8 = local_9d8 - 1;
                break;
              }
            }
          }
        }
      }
    }
    if (local_9d8 == 0) {
      uStack_9e0._7_1_ = false;
      goto LAB_0098c2df;
    }
  }
  ON_3dPoint::operator-(&local_bc0,&this->m_CamLoc,p);
  v[3][7] = ON_3dVector::operator*(&local_bc0,&this->m_CamZ);
  t[0] = v[3][7];
  for (k = 1; k < local_9d8; k = k + 1) {
    ON_3dPoint::operator-(&local_bd8,&this->m_CamLoc,p + k);
    dVar7 = ON_3dVector::operator*(&local_bd8,&this->m_CamZ);
    dVar5 = dVar7;
    if ((v[3][7] <= dVar7) && (dVar5 = v[3][7], t[0] < dVar7)) {
      t[0] = dVar7;
    }
    v[3][7] = dVar5;
  }
  if ((uStack_9e0._5_1_ & 1) != 0) {
    if (t[0] < 0.0) {
      uStack_9e0._7_1_ = false;
      goto LAB_0098c2df;
    }
    if (v[3][7] < 0.0) {
      v[3][7] = 0.0;
    }
  }
  if ((near_dist != (double *)0x0) &&
     (((!bGrowNearFar || (bVar2 = ON_IsValid(*near_dist), !bVar2)) || (v[3][7] < *near_dist)))) {
    *near_dist = v[3][7];
  }
  if ((far_dist != (double *)0x0) &&
     (((!bGrowNearFar || (bVar2 = ON_IsValid(*far_dist), !bVar2)) ||
      (*far_dist <= t[0] && t[0] != *far_dist)))) {
    *far_dist = t[0];
  }
  uStack_9e0._7_1_ = true;
LAB_0098c2df:
  if ((bool)uStack_9e0._7_1_ == false) {
    local_bf4 = 0;
  }
  else {
    local_bf4 = 2;
    if ((uStack_9e0._6_1_ & 1) != 0) {
      local_bf4 = 1;
    }
  }
  return local_bf4;
}

Assistant:

int ON_Viewport::GetBoundingBoxDepth(       
       ON_BoundingBox bbox,
       const ON_Xform* bbox_xform,
       double* near_dist,
       double* far_dist,
       bool bGrowNearFar
       ) const
{
  // The Xbuffer[] stuff is to skip wasting time in unneeded constructors.
  // The buffers are double arrays to insure alignments are correct.
  ON_3dPoint* C;
  ON_3dPoint* P;
  ON_PlaneEquation* S;
  ON_Line* L;
  ON_3dPoint Q;
  double Pbuffer[(8+8+8+48)*(sizeof(P[0])/sizeof(double))];
  double Sbuffer[5*(sizeof(S[0])/sizeof(double))];
  double Lbuffer[4*(sizeof(L[0])/sizeof(double))];
  double d, t[2], v[4][8], v0, v1;
  const double tol = ON_SQRT_EPSILON*(1.0 + m_CamLoc.MaximumCoordinate());
  C = (ON_3dPoint*)Pbuffer;
  P = C+8;
  S = (ON_PlaneEquation*)Sbuffer;
  L = (ON_Line*)Lbuffer;
  unsigned int i, j, k, Pin, Pout, Pcount;
  bool rc;
  bool bTrimmed = false;
  const bool bPerspectiveProjection = (ON::perspective_view == m_projection);

  for (;;)
  {
    rc = bbox.GetCorners(C);
    if (!rc)
      break;
    
    if (nullptr != bbox_xform)
    {
      rc = bbox_xform->IsValid();
      if (!rc)
        break;
    }

    rc = GetFrustumLeftPlaneEquation(S[0]);
    if (!rc)
      break;
    rc = GetFrustumRightPlaneEquation(S[1]);
    if (!rc)
      break;
    rc = GetFrustumBottomPlaneEquation(S[2]);
    if (!rc)
      break;
    rc = GetFrustumTopPlaneEquation(S[3]);
    if (!rc)
      break;

    S[4].Create(m_CamLoc,-m_CamZ);
    
    Pcount = 0;
    Pin = 0;
    Pout = 0;

    for ( i = 0; i < 8; i++ )
    {
      if ( nullptr != bbox_xform )
        C[i] = (*bbox_xform)*C[i];

      k = 0;
      if ( (v[0][i] = S[0].ValueAt(C[i])) >= -tol )
        k |= 1;      
      else
        Pout |= 1;
      if ( (v[1][i] = S[1].ValueAt(C[i])) >= -tol )
        k |= 2;
      else
        Pout |= 2;
      if ( (v[2][i] = S[2].ValueAt(C[i])) >= -tol )
        k |= 4;
      else
        Pout |= 4;
      if ( (v[3][i] = S[3].ValueAt(C[i])) >= -tol )
        k |= 8;
      else
        Pout |= 8;

      if ( !bPerspectiveProjection || S[4].ValueAt(C[i]) > 0.0 )
        k |= 16;

      Pin |= k;
      if ( (1|2|4|8|16) == k )
      {
        // C[i] is inside the infinite frustum
        P[Pcount++] = C[i];
      }
    }

    if ( Pcount < 8 )
    {
      bTrimmed = true;
      // some portion of bbox is outside the infinite frustum
      if ( (1|2|4|8|16) != Pin )
      {
        // bbox does not intersect the infinite frustum.
        rc = false;
        break;
      }

      j = 0;
      if ( bPerspectiveProjection )
      {
        if ( bbox.MinimumDistanceTo(m_CamLoc) <= 0.0 )
        {
          // camera location is in the bounding box
          P[Pcount++] = m_CamLoc;
          j = 1; // j = 1 indicates m_CamLoc has been added to P[].
        }
        L[0].from = m_CamLoc;
        L[1].from = m_CamLoc;
        L[2].from = m_CamLoc;
        L[3].from = m_CamLoc;
      }
      else
      {
        rc = GetNearRect(L[0].from,L[1].from,L[2].from,L[3].from);
        if (!rc)
          break;
      }

      rc = GetFarRect(L[0].to,L[1].to,L[2].to,L[3].to);
      if (!rc)
        break;

      const unsigned int Linout[4] = {
        1|4, // intersection of left and bottom frustum sides
        2|4, // intersection of right and bottom frustum sides
        1|8, // intersection of left and top frustum sides
        2|8  // intersection of right and top frustum sides
        };

      k = Pin & Pout;
      for ( i = 0; i < 4; i++ )
      {
        // The Linout[i] == ... test is true if bbox is on both sides
        // of both planes whose intersection defines the line L[i].
        // The fast integer test helps cull unnecessary calls to
        // the expensive ON_Intersect() function.
        if (    Linout[i] == (k & Linout[i]) 
             && ON_Intersect(bbox,L[i],tol,(ON_Interval*)t) 
           )
        {
          if ( bPerspectiveProjection )
          {
            if ( t[1] < 0.0 )
              continue;
            if ( t[0] < 0.0 )
            {
              if ( 0 == j )
              {
                P[Pcount++] = m_CamLoc;
                j = 1; // j = 1 indicates m_CamLoc has been added to P[].
              }
              t[0] = t[1];
            }
          }
          P[Pcount++] = L[i].PointAt(t[0]);
          if ( t[1] > t[0] )
            P[Pcount++] = L[i].PointAt(t[1]);
        }
      }

      // intersect box edges with frustum sides
      // The 12 bbox edges have endpoints
      // C[e[*][0]] and C[E[*][1]]
      const unsigned int e[12][2] = {
        {0,1},{2,3},{4,5},{6,7},
        {0,2},{1,3},{4,6},{5,7},
        {0,4},{1,5},{2,6},{3,7}};

      for ( i = 0; i < 4; i++ )
      {
        for ( j = 0; j < 12; j++ )
        {
          v0 = v[i][e[j][0]];
          v1 = v[i][e[j][1]];
          if ( v0*v1 < 0.0 )
          {
            // this box edge crosses the frustum side plane
            d = v0/(v0-v1);
            P[Pcount++] = Q = (1.0-d)*C[e[j][0]] + d*C[e[j][1]];
            // verify that Q is in the frustum
            for ( k = 0; k < 4; k++ )
            {
              if ( i != k && S[k].ValueAt(Q) <= -tol )
              {
                // Q is not in the view frustum
                Pcount--;
                break;
              }
            }
          }
        }
      }
      if ( 0 == Pcount )
      {
        rc = false;
        break;
      }
    }

    t[0] = t[1] = (m_CamLoc - P[0])*m_CamZ;
    for ( i = 1; i < Pcount; i++ )
    {
      d = (m_CamLoc - P[i])*m_CamZ;
      if ( d < t[0] )
        t[0] = d;
      else if ( d > t[1] )
        t[1] = d;
    }

    if ( bPerspectiveProjection )
    {
      if ( t[1] < 0.0 )
      {
        rc = false;
        break;
      }
      if ( t[0] < 0.0 )
        t[0] = 0.0;
    }

    if ( 0 != near_dist && (!bGrowNearFar || !ON_IsValid(*near_dist) || t[0] < *near_dist) )
      *near_dist = t[0];
    if ( 0 != far_dist && (!bGrowNearFar || !ON_IsValid(*far_dist) || t[1] > *far_dist) )
      *far_dist = t[1];

    rc = true;
    break;
  }

  // 0 = out, 1 = partially in infinite frustum, 2 = all in infinite frustum
  return (rc) ? (bTrimmed ? 1 : 2) : 0;
}